

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int cm_zlib_gzungetc(int c,gzFile file)

{
  uint uVar1;
  uint uVar2;
  off_t oVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  
  if (file != (gzFile)0x0) {
    if (((file[1].have == 0x1c4f) && (*(int *)((long)&file[2].pos + 4) == 0)) && (file->have == 0))
    {
      gz_look((gz_statep)file);
    }
    if ((file[1].have == 0x1c4f) &&
       ((iVar4 = *(int *)((long)&file[4].pos + 4), iVar4 == 0 || (iVar4 == -5)))) {
      if ((int)file[4].pos == 0) {
        if (c < 0) {
          return -1;
        }
      }
      else {
        *(undefined4 *)&file[4].pos = 0;
        iVar4 = gz_skip((gz_statep)file,(off_t)file[4].next);
        if (c < 0) {
          return -1;
        }
        if (iVar4 == -1) {
          return -1;
        }
      }
      uVar1 = file->have;
      if ((ulong)uVar1 == 0) {
        file->have = 1;
        oVar3 = file[1].pos;
        file->next = file[2].next + ((ulong)(uint)((int)oVar3 * 2) - 1);
        file[2].next[(ulong)(uint)((int)oVar3 * 2) - 1] = (uchar)c;
      }
      else {
        uVar2 = (int)file[1].pos * 2;
        if (uVar1 == uVar2) {
          cm_zlib_gz_error((gz_statep)file,-3,"out of room to push characters");
          return -1;
        }
        puVar5 = file[2].next;
        if (file->next == puVar5) {
          puVar6 = puVar5 + uVar2;
          for (puVar5 = puVar5 + uVar1; file[2].next < puVar5; puVar5 = puVar5 + -1) {
            puVar6[-1] = puVar5[-1];
            puVar6 = puVar6 + -1;
          }
          file->next = puVar6;
        }
        file->have = file->have + 1;
        puVar5 = file->next;
        file->next = puVar5 + -1;
        puVar5[-1] = (uchar)c;
      }
      file->pos = file->pos + -1;
      *(undefined4 *)((long)&file[3].next + 4) = 0;
      return c;
    }
  }
  return -1;
}

Assistant:

int ZEXPORT gzungetc(int c, gzFile file) {
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* in case this was just opened, set up the input buffer */
    if (state->mode == GZ_READ && state->how == LOOK && state->x.have == 0)
        (void)gz_look(state);

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
        (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return -1;
    }

    /* can't push EOF */
    if (c < 0)
        return -1;

    /* if output buffer empty, put byte at end (allows more pushing) */
    if (state->x.have == 0) {
        state->x.have = 1;
        state->x.next = state->out + (state->size << 1) - 1;
        state->x.next[0] = (unsigned char)c;
        state->x.pos--;
        state->past = 0;
        return c;
    }

    /* if no room, give up (must have already done a gzungetc()) */
    if (state->x.have == (state->size << 1)) {
        gz_error(state, Z_DATA_ERROR, "out of room to push characters");
        return -1;
    }

    /* slide output data if needed and insert byte before existing data */
    if (state->x.next == state->out) {
        unsigned char *src = state->out + state->x.have;
        unsigned char *dest = state->out + (state->size << 1);
        while (src > state->out)
            *--dest = *--src;
        state->x.next = dest;
    }
    state->x.have++;
    state->x.next--;
    state->x.next[0] = (unsigned char)c;
    state->x.pos--;
    state->past = 0;
    return c;
}